

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O3

type_conflict3 *
chaiscript::parse_num<long_double>(type_conflict3 *__return_storage_ptr__,string_view t_str)

{
  byte bVar1;
  float fVar2;
  type_conflict3 *in_RAX;
  int iVar3;
  const_iterator __begin2;
  
  if (__return_storage_ptr__ != (type_conflict3 *)0x0) {
    in_RAX = (type_conflict3 *)0x0;
    iVar3 = 0;
    fVar2 = 0.0;
    do {
      bVar1 = *(byte *)(t_str._M_len + (long)in_RAX);
      if (bVar1 - 0x30 < 10) {
        if (10.0 <= fVar2) {
          fVar2 = fVar2 * 10.0;
        }
      }
      else if (bVar1 < 0x45) {
        if (bVar1 == 0x2d) {
          iVar3 = -1;
        }
        else if (bVar1 == 0x2e) {
          fVar2 = 10.0;
        }
      }
      else if ((bVar1 == 0x45) || (bVar1 == 0x65)) {
        iVar3 = 1;
        fVar2 = 0.0;
      }
      in_RAX = (type_conflict3 *)((long)in_RAX + 1);
    } while (__return_storage_ptr__ != in_RAX);
    if (iVar3 != 0) {
      in_RAX = (type_conflict3 *)powl();
    }
  }
  return in_RAX;
}

Assistant:

[[nodiscard]] auto parse_num(const std::string_view t_str) -> typename std::enable_if<!std::is_integral<T>::value, T>::type {
    T t = 0;
    T base{};
    T decimal_place = 0;
    int exponent = 0;

    for (const auto c : t_str) {
      switch (c) {
        case '.':
          decimal_place = 10;
          break;
        case 'e':
        case 'E':
          exponent = 1;
          decimal_place = 0;
          base = t;
          t = 0;
          break;
        case '-':
          exponent = -1;
          break;
        case '+':
          break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
          if (decimal_place < 10) {
            t *= 10;
            t += static_cast<T>(c - '0');
          } else {
            t += static_cast<T>(c - '0') / decimal_place;
            decimal_place *= 10;
          }
          break;
        default:
          break;
      }
    }
    return exponent ? base * std::pow(T(10), t * static_cast<T>(exponent)) : t;
  }